

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void kj::ArrayDisposer::Dispose_<capnp::_::RpcSystemBase::RpcConnectionState::Export>::destruct
               (void *ptr)

{
  PromiseArenaMember *node;
  long *plVar1;
  
  if (*(long *)((long)ptr + 0x30) != 0) {
    *(undefined8 *)((long)ptr + 0x30) = 0;
    (**(code **)**(undefined8 **)((long)ptr + 0x28))();
  }
  if ((*(char *)((long)ptr + 0x18) == '\x01') &&
     (node = *(PromiseArenaMember **)((long)ptr + 0x20), node != (PromiseArenaMember *)0x0)) {
    *(undefined8 *)((long)ptr + 0x20) = 0;
    kj::_::PromiseDisposer::dispose(node);
  }
  plVar1 = *(long **)((long)ptr + 0x10);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)((long)ptr + 0x10) = 0;
    (**(code **)**(undefined8 **)((long)ptr + 8))
              (*(undefined8 **)((long)ptr + 8),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    return;
  }
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }